

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldStateTest_MergeFromMapDirty_Test::
~MapFieldStateTest_MergeFromMapDirty_Test(MapFieldStateTest_MergeFromMapDirty_Test *this)

{
  MapFieldStateTest::~MapFieldStateTest
            ((MapFieldStateTest *)&this[-1].super_MapFieldStateTest.map_field_base_);
  return;
}

Assistant:

TEST_P(MapFieldStateTest, MergeFromMapDirty) {
  ArenaHolder<MapFieldType> other(arena_.get());
  MakeMapDirty(other.get());

  map_field_->MergeFrom(*other);

  if (state_ != MAP_DIRTY) {
    Expect(map_field_.get(), MAP_DIRTY, 1, 1);
  } else {
    Expect(map_field_.get(), MAP_DIRTY, 1, 0);
  }

  Expect(other.get(), MAP_DIRTY, 1, 0);
}